

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  string *psVar1;
  byte *pbVar2;
  int iVar3;
  uint32_t uVar5;
  LogMessage local_20 [16];
  int iVar4;
  
  pbVar2 = this->buffer_;
  iVar4 = (int)this->buffer_end_;
  iVar3 = iVar4 - (int)pbVar2;
  if (9 < iVar3) {
LAB_002a4de5:
    if (*pbVar2 == first_byte_or_zero) {
      if (first_byte_or_zero == 0) {
        this->buffer_ = pbVar2 + 1;
        return 0;
      }
      if ((char)first_byte_or_zero < '\0') {
        uVar5 = ((uint)pbVar2[1] * 0x80 + first_byte_or_zero) - 0x80;
        if ((char)pbVar2[1] < '\0') {
          uVar5 = (uVar5 + (uint)pbVar2[2] * 0x4000) - 0x4000;
          if ((char)pbVar2[2] < '\0') {
            uVar5 = (uVar5 + (uint)pbVar2[3] * 0x200000) - 0x200000;
            if ((char)pbVar2[3] < '\0') {
              uVar5 = uVar5 + (uint)pbVar2[4] * 0x10000000 + 0xf0000000;
              if ((char)pbVar2[4] < '\0') {
                pbVar2 = pbVar2 + 6;
                iVar3 = 5;
                while ((char)pbVar2[-1] < '\0') {
                  pbVar2 = pbVar2 + 1;
                  iVar3 = iVar3 + -1;
                  if (iVar3 == 0) {
                    return 0;
                  }
                }
              }
              else {
                pbVar2 = pbVar2 + 5;
              }
            }
            else {
              pbVar2 = pbVar2 + 4;
            }
          }
          else {
            pbVar2 = pbVar2 + 3;
          }
        }
        else {
          pbVar2 = pbVar2 + 2;
        }
        this->buffer_ = pbVar2;
        return uVar5;
      }
    }
    else {
      ReadTagFallback();
    }
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,0x80,"first_byte & 0x80 == 0x80");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x1ae,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
    absl::lts_20240722::log_internal::LogMessage::operator<<(local_20,first_byte_or_zero);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  if (iVar3 < 1) {
    if (iVar4 == (int)pbVar2) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_002a4de5;
  uVar5 = ReadTagSlow(this);
  return uVar5;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}